

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qhttpnetworkconnectionchannel_p.cpp
# Opt level: O0

void QHttpNetworkConnectionChannel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QMetaType QVar1;
  QList<QSslError> *in_RCX;
  uint in_EDX;
  int in_ESI;
  QHttpNetworkConnectionChannel *in_RDI;
  long in_FS_OFFSET;
  QHttpNetworkConnectionChannel *_t;
  QLocalSocket *in_stack_ffffffffffffff58;
  QHttpNetworkConnectionChannel *in_stack_ffffffffffffff60;
  QMetaType local_68;
  QMetaTypeInterface *local_60;
  QMetaType local_58;
  QMetaTypeInterface *local_50;
  QMetaType local_48;
  QMetaTypeInterface *local_40;
  QMetaType local_38;
  QAbstractSocket *in_stack_ffffffffffffffd0;
  QMetaType in_stack_ffffffffffffffd8;
  QHttpNetworkConnectionChannel *in_stack_ffffffffffffffe0;
  QMetaType local_18;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    switch((QNetworkProxy *)(ulong)in_EDX) {
    case (QNetworkProxy *)0x0:
      _q_receiveReply(in_stack_ffffffffffffff60);
      break;
    case (QNetworkProxy *)0x1:
      _q_bytesWritten(in_stack_ffffffffffffff60,(qint64)in_stack_ffffffffffffff58);
      break;
    case (QNetworkProxy *)0x2:
      _q_readyRead(in_stack_ffffffffffffff60);
      break;
    case (QNetworkProxy *)0x3:
      _q_disconnected(in_stack_ffffffffffffff60);
      break;
    case (QNetworkProxy *)0x4:
      _q_connected_abstract_socket
                ((QHttpNetworkConnectionChannel *)in_stack_ffffffffffffffd8.d_ptr,
                 in_stack_ffffffffffffffd0);
      break;
    case (QNetworkProxy *)0x5:
      _q_connected_local_socket(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      break;
    case (QNetworkProxy *)0x6:
      _q_connected(in_RDI);
      break;
    case (QNetworkProxy *)0x7:
      _q_error((QHttpNetworkConnectionChannel *)in_stack_ffffffffffffffd8.d_ptr,
               (SocketError)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
      break;
    case (QNetworkProxy *)0x8:
      _q_proxyAuthenticationRequired
                (in_RDI,(QNetworkProxy *)(ulong)in_EDX,(QAuthenticator *)in_stack_ffffffffffffff60);
      break;
    case (QNetworkProxy *)0x9:
      _q_uploadDataReadyRead(in_stack_ffffffffffffff60);
      break;
    case (QNetworkProxy *)0xa:
      _q_encrypted(in_stack_ffffffffffffffe0);
      break;
    case (QNetworkProxy *)0xb:
      _q_sslErrors((QHttpNetworkConnectionChannel *)(ulong)in_EDX,in_RCX);
      break;
    case (QNetworkProxy *)0xc:
      _q_preSharedKeyAuthenticationRequired
                ((QHttpNetworkConnectionChannel *)(ulong)in_EDX,
                 (QSslPreSharedKeyAuthenticator *)in_RCX);
      break;
    case (QNetworkProxy *)0xd:
      _q_encryptedBytesWritten(in_stack_ffffffffffffff60,(qint64)in_stack_ffffffffffffff58);
    }
  }
  if (in_ESI == 7) {
    switch(in_EDX) {
    case 4:
      if (*(int *)&(((in_RCX->d).ptr)->d)._M_t.
                   super___uniq_ptr_impl<QSslErrorPrivate,_std::default_delete<QSslErrorPrivate>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_QSslErrorPrivate_*,_std::default_delete<QSslErrorPrivate>_>
                   .super__Head_base<0UL,_QSslErrorPrivate_*,_false>._M_head_impl == 0) {
        QVar1 = QMetaType::fromType<QAbstractSocket*>();
        *(QMetaTypeInterface **)&((in_RCX->d).d)->super_QArrayData = QVar1.d_ptr;
      }
      else {
        memset(&local_18,0,8);
        QMetaType::QMetaType(&local_18);
        *(QMetaTypeInterface **)&((in_RCX->d).d)->super_QArrayData = local_18.d_ptr;
      }
      break;
    case 5:
      if (*(int *)&(((in_RCX->d).ptr)->d)._M_t.
                   super___uniq_ptr_impl<QSslErrorPrivate,_std::default_delete<QSslErrorPrivate>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_QSslErrorPrivate_*,_std::default_delete<QSslErrorPrivate>_>
                   .super__Head_base<0UL,_QSslErrorPrivate_*,_false>._M_head_impl == 0) {
        QVar1 = QMetaType::fromType<QLocalSocket*>();
        *(QMetaTypeInterface **)&((in_RCX->d).d)->super_QArrayData = QVar1.d_ptr;
      }
      else {
        memset(&stack0xffffffffffffffd8,0,8);
        QMetaType::QMetaType((QMetaType *)&stack0xffffffffffffffd8);
        *(QMetaTypeInterface **)&((in_RCX->d).d)->super_QArrayData = in_stack_ffffffffffffffd8.d_ptr
        ;
      }
      break;
    default:
      memset(&local_10,0,8);
      QMetaType::QMetaType(&local_10);
      *(QMetaTypeInterface **)&((in_RCX->d).d)->super_QArrayData = local_10.d_ptr;
      break;
    case 7:
      if (*(int *)&(((in_RCX->d).ptr)->d)._M_t.
                   super___uniq_ptr_impl<QSslErrorPrivate,_std::default_delete<QSslErrorPrivate>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_QSslErrorPrivate_*,_std::default_delete<QSslErrorPrivate>_>
                   .super__Head_base<0UL,_QSslErrorPrivate_*,_false>._M_head_impl == 0) {
        local_40 = (QMetaTypeInterface *)QMetaType::fromType<QAbstractSocket::SocketError>();
        *(QMetaTypeInterface **)&((in_RCX->d).d)->super_QArrayData = local_40;
      }
      else {
        memset(&local_38,0,8);
        QMetaType::QMetaType(&local_38);
        *(QMetaTypeInterface **)&((in_RCX->d).d)->super_QArrayData = local_38.d_ptr;
      }
      break;
    case 8:
      if (*(int *)&(((in_RCX->d).ptr)->d)._M_t.
                   super___uniq_ptr_impl<QSslErrorPrivate,_std::default_delete<QSslErrorPrivate>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_QSslErrorPrivate_*,_std::default_delete<QSslErrorPrivate>_>
                   .super__Head_base<0UL,_QSslErrorPrivate_*,_false>._M_head_impl == 0) {
        local_50 = (QMetaTypeInterface *)QMetaType::fromType<QNetworkProxy>();
        *(QMetaTypeInterface **)&((in_RCX->d).d)->super_QArrayData = local_50;
      }
      else {
        memset(&local_48,0,8);
        QMetaType::QMetaType(&local_48);
        *(QMetaTypeInterface **)&((in_RCX->d).d)->super_QArrayData = local_48.d_ptr;
      }
      break;
    case 0xb:
      if (*(int *)&(((in_RCX->d).ptr)->d)._M_t.
                   super___uniq_ptr_impl<QSslErrorPrivate,_std::default_delete<QSslErrorPrivate>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_QSslErrorPrivate_*,_std::default_delete<QSslErrorPrivate>_>
                   .super__Head_base<0UL,_QSslErrorPrivate_*,_false>._M_head_impl == 0) {
        local_60 = (QMetaTypeInterface *)QMetaType::fromType<QList<QSslError>>();
        *(QMetaTypeInterface **)&((in_RCX->d).d)->super_QArrayData = local_60;
      }
      else {
        memset(&local_58,0,8);
        QMetaType::QMetaType(&local_58);
        *(QMetaTypeInterface **)&((in_RCX->d).d)->super_QArrayData = local_58.d_ptr;
      }
      break;
    case 0xc:
      if (*(int *)&(((in_RCX->d).ptr)->d)._M_t.
                   super___uniq_ptr_impl<QSslErrorPrivate,_std::default_delete<QSslErrorPrivate>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_QSslErrorPrivate_*,_std::default_delete<QSslErrorPrivate>_>
                   .super__Head_base<0UL,_QSslErrorPrivate_*,_false>._M_head_impl == 0) {
        QVar1 = QMetaType::fromType<QSslPreSharedKeyAuthenticator*>();
        *(QMetaTypeInterface **)&((in_RCX->d).d)->super_QArrayData = QVar1.d_ptr;
      }
      else {
        memset(&local_68,0,8);
        QMetaType::QMetaType(&local_68);
        *(QMetaTypeInterface **)&((in_RCX->d).d)->super_QArrayData = local_68.d_ptr;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkConnectionChannel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QHttpNetworkConnectionChannel *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->_q_receiveReply(); break;
        case 1: _t->_q_bytesWritten((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        case 2: _t->_q_readyRead(); break;
        case 3: _t->_q_disconnected(); break;
        case 4: _t->_q_connected_abstract_socket((*reinterpret_cast< std::add_pointer_t<QAbstractSocket*>>(_a[1]))); break;
        case 5: _t->_q_connected_local_socket((*reinterpret_cast< std::add_pointer_t<QLocalSocket*>>(_a[1]))); break;
        case 6: _t->_q_connected(); break;
        case 7: _t->_q_error((*reinterpret_cast< std::add_pointer_t<QAbstractSocket::SocketError>>(_a[1]))); break;
        case 8: _t->_q_proxyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QNetworkProxy>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 9: _t->_q_uploadDataReadyRead(); break;
        case 10: _t->_q_encrypted(); break;
        case 11: _t->_q_sslErrors((*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[1]))); break;
        case 12: _t->_q_preSharedKeyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[1]))); break;
        case 13: _t->_q_encryptedBytesWritten((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAbstractSocket* >(); break;
            }
            break;
        case 5:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QLocalSocket* >(); break;
            }
            break;
        case 7:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAbstractSocket::SocketError >(); break;
            }
            break;
        case 8:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkProxy >(); break;
            }
            break;
        case 11:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            }
            break;
        case 12:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslPreSharedKeyAuthenticator* >(); break;
            }
            break;
        }
    }
}